

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O3

void FAudio_INTERNAL_Mix_Generic_Scalar
               (uint32_t toMix,uint32_t srcChans,uint32_t dstChans,float *src,float *dst,
               float *coefficients)

{
  ulong uVar1;
  uint32_t uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  
  if (toMix != 0) {
    uVar1 = (ulong)srcChans;
    uVar2 = 0;
    do {
      if (dstChans != 0) {
        lVar4 = 0;
        uVar5 = 0;
        do {
          if (srcChans != 0) {
            fVar6 = dst[uVar5];
            uVar3 = 0;
            do {
              fVar6 = fVar6 + src[uVar3] * coefficients[(uint)((int)lVar4 + (int)uVar3)];
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
            dst[uVar5] = fVar6;
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + uVar1;
        } while (uVar5 != dstChans);
      }
      uVar2 = uVar2 + 1;
      dst = dst + dstChans;
      src = src + uVar1;
    } while (uVar2 != toMix);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_Generic_Scalar(
	uint32_t toMix,
	uint32_t srcChans,
	uint32_t dstChans,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i, co, ci;
	for (i = 0; i < toMix; i += 1, src += srcChans, dst += dstChans)
	for (co = 0; co < dstChans; co += 1)
	{
		for (ci = 0; ci < srcChans; ci += 1)
		{
			dst[co] += (
				src[ci] *
				coefficients[co * srcChans + ci]
			);
		}
	}
}